

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O2

int Cut_CellTruthLookup(uint *pTruth,int nVars)

{
  int *piVar1;
  uint *pOut;
  Cut_CMan_t *pCVar2;
  Cut_Cell_t *pCVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  Cut_Cell_t *pTemp;
  Cut_Cell_t Cell;
  
  pCVar2 = s_pCMan;
  if (s_pCMan == (Cut_CMan_t *)0x0) {
    puts("Cut_CellTruthLookup: Cell manager is not defined.");
  }
  else {
    memset(&Cell,0,0x98);
    Cell._32_4_ = nVars & 0xf;
    pOut = Cell.uTruth;
    Extra_TruthCopy(pOut,pTruth,nVars);
    Cut_CellSuppMin(&Cell);
    for (uVar6 = 0; (Cell._32_4_ & 0xf) != uVar6; uVar6 = uVar6 + 1) {
      Cell.CanonPerm[uVar6] = (char)uVar6;
    }
    uVar4 = Extra_TruthSemiCanonicize
                      (pOut,pCVar2->puAux,Cell._32_4_ & 0xf,Cell.CanonPerm,Cell.Store);
    iVar5 = 1 << ((char)(Cell._32_4_ & 0xf) - 5U & 0x1f);
    if ((Cell._32_4_ & 0xf) < 6) {
      iVar5 = 1;
    }
    Cell._32_4_ = Cell._32_4_ & 0x3fff | uVar4 << 0xe;
    uVar4 = Extra_TruthHash(pOut,iVar5);
    iVar5 = st__lookup(pCVar2->tTable,(char *)(ulong)uVar4,(char **)&pTemp);
    if (pTemp != (Cut_Cell_t *)0x0 && iVar5 != 0) {
      uVar4 = Cell._32_4_ & 0xf;
      do {
        pCVar3 = pTemp;
        if (((*(uint *)&pTemp->field_0x20 & 0xf) == uVar4) &&
           (iVar5 = Extra_TruthIsEqual(pTemp->uTruth,pOut,uVar4), iVar5 != 0)) {
          piVar1 = &pCVar3->nUsed;
          *piVar1 = *piVar1 + 1;
          pCVar2->nCellFound = pCVar2->nCellFound + 1;
          return 1;
        }
        pTemp = pCVar3->pNext;
      } while (pTemp != (Cut_Cell_t *)0x0);
    }
    pCVar2->nCellNotFound = pCVar2->nCellNotFound + 1;
  }
  return 0;
}

Assistant:

int Cut_CellTruthLookup( unsigned * pTruth, int nVars )
{
    Cut_CMan_t * p = s_pCMan;
    Cut_Cell_t * pTemp;
    Cut_Cell_t Cell, * pCell = &Cell;
    unsigned Hash;
    int i;

    // cell manager is not defined
    if ( p == NULL )
    {
        printf( "Cut_CellTruthLookup: Cell manager is not defined.\n" );
        return 0;
    }

    // canonicize
    memset( pCell, 0, sizeof(Cut_Cell_t) );
    pCell->nVars = nVars;
    Extra_TruthCopy( pCell->uTruth, pTruth, nVars );
    Cut_CellSuppMin( pCell );
    // set the elementary permutation
    for ( i = 0; i < (int)pCell->nVars; i++ )
        pCell->CanonPerm[i] = i;
    // canonicize
    pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );


    // check if the cell exists
    Hash = Extra_TruthHash( pCell->uTruth, Extra_TruthWordNum(pCell->nVars) );
    if ( st__lookup( p->tTable, (char *)(ABC_PTRUINT_T)Hash, (char **)&pTemp ) )
    {
        for ( ; pTemp; pTemp = pTemp->pNext )
        {
            if ( pTemp->nVars != pCell->nVars )
                continue;
            if ( Extra_TruthIsEqual(pTemp->uTruth, pCell->uTruth, pCell->nVars) )
            {
                pTemp->nUsed++;
                p->nCellFound++;
                return 1;
            }
        }
    }
    p->nCellNotFound++;
    return 0;
}